

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,slang::DiagnosticSeverity>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>
::unchecked_insert<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>const&>
          (table_core<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,slang::DiagnosticSeverity>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::DiagCode,void>,std::equal_to<slang::DiagCode>,std::allocator<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>>>
           *this,pair<const_slang::DiagCode,_slang::DiagnosticSeverity> *x)

{
  undefined1 auVar1 [16];
  ulong hash;
  locator res;
  locator local_20;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)(x->first).code | (ulong)(uint)((int)x->first << 0x10);
  hash = SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar1 * ZEXT816(0x9e3779b97f4a7c15),0);
  nosize_unchecked_emplace_at<std::pair<slang::DiagCode_const,slang::DiagnosticSeverity>const&>
            (&local_20,this,(arrays_type *)this,hash >> ((byte)*this & 0x3f),hash,x);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  return;
}

Assistant:

void unchecked_insert(Value&& x) {
        auto hash = hash_for(key_from(x));
        unchecked_emplace_at(position_for(hash), hash, std::forward<Value>(x));
    }